

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O2

void __thiscall ExprVisitorTest_InvalidExpr_Test::TestBody(ExprVisitorTest_InvalidExpr_Test *this)

{
  bool bVar1;
  MockSpec<void_*(unsigned_long)> *pMVar2;
  TypedExpectation<void_*(unsigned_long)> *pTVar3;
  NumericConstant e;
  long lVar4;
  LogicalConstant e_00;
  char *pcVar5;
  AssertHelper local_200;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_> f;
  char buffer [100];
  NiceMock<MockAllocator> alloc;
  
  testing::NiceMock<MockAllocator>::NiceMock(&alloc);
  f._vptr_BasicExprFactory = (_func_int **)&PTR__BasicExprFactory_001cea20;
  f.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f.funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f.funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f.funcs_.
  super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  f.super_AllocatorRef<testing::NiceMock<MockAllocator>,_char>.alloc_ = &alloc;
  testing::A<unsigned_long>();
  pMVar2 = MockAllocator::gmock_allocate
                     (&alloc.super_MockAllocator,(Matcher<unsigned_long> *)&gtest_expected_message);
  pTVar3 = testing::internal::MockSpec<void_*(unsigned_long)>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
                      ,0x231,"alloc","allocate(_)");
  local_200.data_ = (AssertHelperData *)buffer;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&gtest_ar);
  testing::internal::TypedExpectation<void_*(unsigned_long)>::WillOnce
            (pTVar3,(Action<void_*(unsigned_long)> *)&gtest_ar);
  testing::internal::linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_> *)&gtest_ar);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&gtest_expected_message);
  e = mp::BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_>::
      MakeNumericConstant(&f,0.0);
  for (lVar4 = 0; lVar4 != 100; lVar4 = lVar4 + 1) {
    buffer[lVar4] = '\0';
  }
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"invalid expression",(allocator<char> *)&local_200)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
                ((BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *)
                 &(this->super_ExprVisitorTest).visitor_,
                 (Expr)e.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_)
      ;
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [104])
               "Expected: visitor_.Visit(e1) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_200,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
             ,0x234,pcVar5);
  testing::internal::AssertHelper::operator=(&local_200,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_200);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::A<unsigned_long>();
  pMVar2 = MockAllocator::gmock_allocate
                     (&alloc.super_MockAllocator,(Matcher<unsigned_long> *)&gtest_expected_message);
  pTVar3 = testing::internal::MockSpec<void_*(unsigned_long)>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
                      ,0x238,"alloc","allocate(_)");
  local_200.data_ = (AssertHelperData *)buffer;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&gtest_ar);
  testing::internal::TypedExpectation<void_*(unsigned_long)>::WillOnce
            (pTVar3,(Action<void_*(unsigned_long)> *)&gtest_ar);
  testing::internal::linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<void_*(unsigned_long)>_> *)&gtest_ar);
  testing::internal::MatcherBase<unsigned_long>::~MatcherBase
            ((MatcherBase<unsigned_long> *)&gtest_expected_message);
  e_00 = mp::BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_>::
         MakeLogicalConstant(&f,false);
  for (lVar4 = 0; lVar4 != 100; lVar4 = lVar4 + 1) {
    buffer[lVar4] = '\0';
  }
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"invalid expression",(allocator<char> *)&local_200)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
                ((BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *)
                 &(this->super_ExprVisitorTest).visitor_,
                 (Expr)e_00.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.
                       impl_);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [104])
               "Expected: visitor_.Visit(e2) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_200,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
             ,0x23b,pcVar5);
  testing::internal::AssertHelper::operator=(&local_200,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&local_200);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::BasicExprFactory<AllocatorRef<testing::NiceMock<MockAllocator>,_char>_>::~BasicExprFactory(&f)
  ;
  testing::NiceMock<MockAllocator>::~NiceMock(&alloc);
  return;
}

Assistant:

TEST_F(ExprVisitorTest, InvalidExpr) {
  using ::testing::_;
  typedef AllocatorRef< ::testing::NiceMock<MockAllocator> > Allocator;
  ::testing::NiceMock<MockAllocator> alloc;
  char buffer[100];
  mp::BasicExprFactory<Allocator> f((Allocator(&alloc)));

  // Corrupt a numeric expression and check if visiting it results in
  // assertion failure.
  EXPECT_CALL(alloc, allocate(_)).WillOnce(::testing::Return(buffer));
  auto e1 = f.MakeNumericConstant(0);
  std::fill(buffer, buffer + sizeof(buffer), 0);
  EXPECT_ASSERT(visitor_.Visit(e1), "invalid expression");

  // Corrupt a logical expression and check if visiting it results in
  // assertion failure.
  EXPECT_CALL(alloc, allocate(_)).WillOnce(::testing::Return(buffer));
  auto e2 = f.MakeLogicalConstant(false);
  std::fill(buffer, buffer + sizeof(buffer), 0);
  EXPECT_ASSERT(visitor_.Visit(e2), "invalid expression");
}